

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rearrangeFunctions.cpp
# Opt level: O1

void __thiscall GraphSam::addConnection(GraphSam *this,int parent,int child)

{
  _Atomic_word *p_Var1;
  GraphNode *this_00;
  pointer psVar2;
  element_type *peVar3;
  bool bVar4;
  int iVar5;
  pointer psVar6;
  pointer psVar7;
  value_type local_50;
  GraphSam *local_40;
  pointer local_38;
  
  psVar6 = (this->m_nodes).
           super__Vector_base<std::shared_ptr<GraphNode>,_std::allocator<std::shared_ptr<GraphNode>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_38 = (this->m_nodes).
             super__Vector_base<std::shared_ptr<GraphNode>,_std::allocator<std::shared_ptr<GraphNode>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar6 != local_38) {
    local_40 = this;
    do {
      this_00 = (psVar6->super___shared_ptr<GraphNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if (this_00->m_value == parent) {
        bVar4 = GraphNode::hasPointer(this_00,child);
        if (bVar4) {
          return;
        }
        psVar2 = (local_40->m_nodes).
                 super__Vector_base<std::shared_ptr<GraphNode>,_std::allocator<std::shared_ptr<GraphNode>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (psVar7 = (local_40->m_nodes).
                      super__Vector_base<std::shared_ptr<GraphNode>,_std::allocator<std::shared_ptr<GraphNode>_>_>
                      ._M_impl.super__Vector_impl_data._M_start; psVar7 != psVar2;
            psVar7 = psVar7 + 1) {
          if (((psVar7->super___shared_ptr<GraphNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->m_value
              == child) {
            peVar3 = (psVar6->super___shared_ptr<GraphNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
            local_50.super___weak_ptr<GraphNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (psVar7->super___shared_ptr<GraphNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
            local_50.super___weak_ptr<GraphNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 (psVar7->super___shared_ptr<GraphNode,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
                 _M_pi;
            if (local_50.super___weak_ptr<GraphNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_50.super___weak_ptr<GraphNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                ->_M_weak_count =
                     (local_50.super___weak_ptr<GraphNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_weak_count + 1;
                UNLOCK();
              }
              else {
                (local_50.super___weak_ptr<GraphNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                ->_M_weak_count =
                     (local_50.super___weak_ptr<GraphNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_weak_count + 1;
              }
            }
            std::vector<std::weak_ptr<GraphNode>,_std::allocator<std::weak_ptr<GraphNode>_>_>::
            push_back(&peVar3->m_pointers,&local_50);
            if (local_50.super___weak_ptr<GraphNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var1 = &(local_50.super___weak_ptr<GraphNode,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi)->_M_weak_count;
                iVar5 = *p_Var1;
                *p_Var1 = *p_Var1 + -1;
                UNLOCK();
              }
              else {
                iVar5 = (local_50.super___weak_ptr<GraphNode,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi)->_M_weak_count;
                (local_50.super___weak_ptr<GraphNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                ->_M_weak_count = iVar5 + -1;
              }
              if (iVar5 == 1) {
                (*(local_50.super___weak_ptr<GraphNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi)->_vptr__Sp_counted_base[3])();
              }
            }
          }
        }
      }
      psVar6 = psVar6 + 1;
    } while (psVar6 != local_38);
  }
  return;
}

Assistant:

void GraphSam::addConnection(int parent, int child) {

    // Search for parent node
    for (auto &n : m_nodes) {
        if (n->getValue() == parent) {

            // Avoid circular connections
            if (n->hasPointer(child))
                return;

            // Search for child node
            for (const auto &m : m_nodes) {
                if (m->getValue() == child)
                    n->addPointer(m);
            }

        }
    }

}